

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQInteger sq_getsize(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType type;
  SQObjectPtr *pSVar1;
  SQClass *pSVar2;
  
  if (idx < 0) {
    pSVar1 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar1 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  type = (pSVar1->super_SQObject)._type;
  if ((int)type < 0xa000020) {
    if (type == OT_STRING) {
      return (SQInteger)
             (((pSVar1->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
             _sharedstate;
    }
    if (type == OT_ARRAY) {
LAB_001125f0:
      return (SQInteger)((pSVar1->super_SQObject)._unVal.pTable)->_firstfree;
    }
    if (type != OT_CLASS) {
LAB_0011260e:
      sq_aux_invalidtype(v,type);
      return -1;
    }
    pSVar2 = (pSVar1->super_SQObject)._unVal.pClass;
  }
  else {
    if (type == OT_TABLE) {
      return ((pSVar1->super_SQObject)._unVal.pTable)->_usednodes;
    }
    if (type == OT_USERDATA) goto LAB_001125f0;
    if (type != OT_INSTANCE) goto LAB_0011260e;
    pSVar2 = ((pSVar1->super_SQObject)._unVal.pClass)->_base;
  }
  return pSVar2->_udsize;
}

Assistant:

SQInteger sq_getsize(HSQUIRRELVM v, SQInteger idx)
{
    SQObjectPtr &o = stack_get(v, idx);
    SQObjectType type = type(o);
    switch(type) {
    case OT_STRING:     return _string(o)->_len;
    case OT_TABLE:      return _table(o)->CountUsed();
    case OT_ARRAY:      return _array(o)->Size();
    case OT_USERDATA:   return _userdata(o)->_size;
    case OT_INSTANCE:   return _instance(o)->_class->_udsize;
    case OT_CLASS:      return _class(o)->_udsize;
    default:
        return sq_aux_invalidtype(v, type);
    }
}